

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffrwrgll(char *rowlist,LONGLONG maxrows,int maxranges,int *numranges,LONGLONG *minrow,
            LONGLONG *maxrow,int *status)

{
  ushort **ppuVar1;
  double dVar2;
  double dvalue;
  LONGLONG maxval;
  LONGLONG minval;
  char *next;
  LONGLONG *maxrow_local;
  LONGLONG *minrow_local;
  int *numranges_local;
  double dStack_20;
  int maxranges_local;
  LONGLONG maxrows_local;
  char *rowlist_local;
  
  if (*status < 1) {
    next = (char *)maxrow;
    maxrow_local = minrow;
    minrow_local = (LONGLONG *)numranges;
    numranges_local._4_4_ = maxranges;
    dStack_20 = (double)maxrows;
    maxrows_local = (LONGLONG)rowlist;
    if (maxrows < 1) {
      *status = 0x7e;
      ffpmsg("Input maximum range value is <= 0 (fits_parse_ranges)");
      rowlist_local._4_4_ = *status;
    }
    else {
      *numranges = 0;
      for (minval = (LONGLONG)rowlist; *(char *)minval == ' '; minval = minval + 1) {
      }
      while (*(char *)minval != '\0') {
        if (*(char *)minval == '-') {
          maxval = 1;
        }
        else {
          ppuVar1 = __ctype_b_loc();
          if (((*ppuVar1)[(int)*(char *)minval] & 0x800) == 0) {
            *status = 0x7e;
            ffpmsg("Syntax error in this row range list:");
            ffpmsg((char *)maxrows_local);
            return *status;
          }
          dVar2 = strtod((char *)minval,(char **)&minval);
          maxval = (LONGLONG)(dVar2 + 0.1);
        }
        for (; *(char *)minval == ' '; minval = minval + 1) {
        }
        if (*(char *)minval == '-') {
          do {
            minval = minval + 1;
          } while (*(char *)minval == ' ');
          ppuVar1 = __ctype_b_loc();
          if (((*ppuVar1)[(int)*(char *)minval] & 0x800) == 0) {
            if ((*(char *)minval != ',') && (*(char *)minval != '\0')) {
              *status = 0x7e;
              ffpmsg("Syntax error in this row range list:");
              ffpmsg((char *)maxrows_local);
              return *status;
            }
            dvalue = dStack_20;
          }
          else {
            dVar2 = strtod((char *)minval,(char **)&minval);
            dvalue = (double)(long)(dVar2 + 0.1);
          }
        }
        else {
          if ((*(char *)minval != ',') && (*(char *)minval != '\0')) {
            *status = 0x7e;
            ffpmsg("Syntax error in this row range list:");
            ffpmsg((char *)maxrows_local);
            return *status;
          }
          dvalue = (double)maxval;
        }
        if (numranges_local._4_4_ < (int)*minrow_local + 1) {
          *status = 0x7e;
          ffpmsg("Overflowed maximum number of ranges (fits_parse_ranges)");
          return *status;
        }
        if (maxval < 1) {
          *status = 0x7e;
          ffpmsg("Syntax error in this row range list: row number < 1");
          ffpmsg((char *)maxrows_local);
          return *status;
        }
        if ((long)dvalue < maxval) {
          *status = 0x7e;
          ffpmsg("Syntax error in this row range list: min > max");
          ffpmsg((char *)maxrows_local);
          return *status;
        }
        if ((0 < (int)*minrow_local) &&
           (maxval <= *(long *)(next + (long)((int)*minrow_local + -1) * 8))) {
          *status = 0x7e;
          ffpmsg("Syntax error in this row range list.  Range minimum is");
          ffpmsg("  less than or equal to previous range maximum");
          ffpmsg((char *)maxrows_local);
          return *status;
        }
        if (maxval <= (long)dStack_20) {
          if ((long)dStack_20 < (long)dvalue) {
            dvalue = dStack_20;
          }
          maxrow_local[(int)*minrow_local] = maxval;
          *(double *)(next + (long)(int)*minrow_local * 8) = dvalue;
          *(int *)minrow_local = (int)*minrow_local + 1;
        }
        for (; *(char *)minval == ' '; minval = minval + 1) {
        }
        if (*(char *)minval == ',') {
          do {
            minval = minval + 1;
          } while (*(char *)minval == ' ');
        }
      }
      if ((int)*minrow_local == 0) {
        *maxrow_local = 1;
        *(double *)next = dStack_20;
        *(undefined4 *)minrow_local = 1;
      }
      rowlist_local._4_4_ = *status;
    }
  }
  else {
    rowlist_local._4_4_ = *status;
  }
  return rowlist_local._4_4_;
}

Assistant:

int ffrwrgll(
      char *rowlist,      /* I - list of rows and row ranges */
      LONGLONG maxrows,       /* I - number of rows in the list */
      int maxranges,     /* I - max number of ranges to be returned */
      int *numranges,    /* O - number ranges returned */
      LONGLONG *minrow,       /* O - first row in each range */
      LONGLONG *maxrow,       /* O - last row in each range */
      int *status)        /* IO - status value */
{
/*
   parse the input list of row ranges, returning the number of ranges,
   and the min and max row value in each range. 

   The only characters allowed in the input rowlist are 
       decimal digits, minus sign, and comma (and non-significant spaces) 

   Example:  

     list = "10-20, 30-35,50"

   would return numranges = 3, minrow[] = {10, 30, 50}, maxrow[] = {20, 35, 50}

   error is returned if min value of range is > max value of range or if the
   ranges are not monotonically increasing.
*/
    char *next;
    LONGLONG minval, maxval;
    double dvalue;

    if (*status > 0)
        return(*status);

    if (maxrows <= 0 ) {
        *status = RANGE_PARSE_ERROR;
        ffpmsg("Input maximum range value is <= 0 (fits_parse_ranges)");
        return(*status);
    }

    next = rowlist;
    *numranges = 0;

    while (*next == ' ')next++;   /* skip spaces */
   
    while (*next != '\0') {

      /* find min value of next range; *next must be '-' or a digit */
      if (*next == '-') {
          minval = 1;    /* implied minrow value = 1 */
      } else if ( isdigit((int) *next) ) {

        /* read as a double, because the string to LONGLONG function */
        /* is platform dependent (strtoll, strtol, _atoI64)          */

          dvalue = strtod(next, &next);
          minval = (LONGLONG) (dvalue + 0.1);

      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      while (*next == ' ')next++;   /* skip spaces */

      /* find max value of next range; *next must be '-', or ',' */
      if (*next == '-') {
          next++;
          while (*next == ' ')next++;   /* skip spaces */

          if ( isdigit((int) *next) ) {

            /* read as a double, because the string to LONGLONG function */
            /* is platform dependent (strtoll, strtol, _atoI64)          */

              dvalue = strtod(next, &next);
              maxval = (LONGLONG) (dvalue + 0.1);

          } else if (*next == ',' || *next == '\0') {
              maxval = maxrows;  /* implied max value */
          } else {
              *status = RANGE_PARSE_ERROR;
              ffpmsg("Syntax error in this row range list:");
              ffpmsg(rowlist);
              return(*status);
          }
      } else if (*next == ',' || *next == '\0') {
          maxval = minval;  /* only a single integer in this range */
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges + 1 > maxranges) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Overflowed maximum number of ranges (fits_parse_ranges)");
          return(*status);
      }

      if (minval < 1 ) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: row number < 1");
          ffpmsg(rowlist);
          return(*status);
      }

      if (maxval < minval) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: min > max");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges > 0) {
          if (minval <= maxrow[(*numranges) - 1]) {
             *status = RANGE_PARSE_ERROR;
             ffpmsg("Syntax error in this row range list.  Range minimum is");
             ffpmsg("  less than or equal to previous range maximum");
             ffpmsg(rowlist);
             return(*status);
         }
      }

      if (minval <= maxrows) {   /* ignore range if greater than maxrows */
          if (maxval > maxrows)
              maxval = maxrows;

           minrow[*numranges] = minval;
           maxrow[*numranges] = maxval;

           (*numranges)++;
      }

      while (*next == ' ')next++;   /* skip spaces */
      if (*next == ',') {
           next++;
           while (*next == ' ')next++;   /* skip more spaces */
      }
    }

    if (*numranges == 0) {  /* a null string was entered */
         minrow[0] = 1;
         maxrow[0] = maxrows;
         *numranges = 1;
    }

    return(*status);
}